

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O2

void generateDatasetImages
               (string *plate_path,string *backgr_path,string *output_folder,int image_size,
               double plate_scale,int nwarps)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  result_type rVar4;
  result_type rVar5;
  ostream *poVar6;
  result_type_conflict2 rVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  _List_node_base *local_2cb8;
  _InputArray local_2ca8;
  double local_2c90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c88;
  int local_2c68;
  int local_2c64;
  uniform_int_distribution<int> intgen;
  undefined8 local_2c10;
  vector local_2c08 [16];
  undefined8 local_2bf8;
  list<cv::Mat,_std::allocator<cv::Mat>_> wrps;
  string name;
  uniform_real_distribution<double> local_2bb8;
  uint local_2ba8;
  uint local_2ba4;
  Mat back;
  Mat resplt;
  string local_2ae0 [32];
  Mat resbg;
  Mat local_2a60 [96];
  Mat blured;
  Mat plate;
  int local_2998;
  ofstream file;
  random_device rd;
  mt19937 gen;
  
  local_2c90 = plate_scale;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&rd,output_folder,auto_format);
  std::filesystem::create_directory((path *)&rd);
  std::filesystem::__cxx11::path::~path((path *)&rd);
  std::random_device::random_device(&rd);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&gen,(ulong)uVar3);
  dVar10 = (double)image_size;
  intgen._M_param._M_b = (int)(dVar10 - local_2c90 * dVar10);
  intgen._M_param._M_a = 1;
  local_2bb8._M_param._M_a = 0.8;
  local_2bb8._M_param._M_b = 1.0;
  cv::imread((string *)&plate,(int)plate_path);
  cv::Mat::Mat(&blured);
  local_2ba8 = local_2998 / 2 | 1;
  _file = 0x1010000;
  _back = 0x2010000;
  local_2ba4 = local_2ba8;
  cv::GaussianBlur(0x4010000000000000,0);
  cv::Mat::Mat(local_2a60,&blured);
  local_2cb8 = (_List_node_base *)&wrps;
  randomWarps_abi_cxx11_((list<cv::Mat,_std::allocator<cv::Mat>_> *)local_2cb8,local_2a60,nwarps);
  cv::Mat::~Mat(local_2a60);
  while( true ) {
    local_2cb8 = (((_List_base<cv::Mat,_std::allocator<cv::Mat>_> *)&local_2cb8->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next;
    if (local_2cb8 == (_List_node_base *)&wrps) break;
    generateDatasetImages::imagenum = generateDatasetImages::imagenum + 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   output_folder,"/");
    std::__cxx11::to_string((string *)&back,generateDatasetImages::imagenum);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                   (string *)&back);
    std::__cxx11::string::~string((string *)&back);
    std::__cxx11::string::~string((string *)&file);
    std::ofstream::ofstream
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file);
    std::__cxx11::string::string(local_2ae0,(string *)backgr_path);
    loadRandomImage((string *)&back);
    std::__cxx11::string::~string(local_2ae0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resplt,
                   &name,".txt");
    std::ofstream::open((string *)&file,
                        (_Ios_Openmode)
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&resplt
                       );
    std::__cxx11::string::~string((string *)&resplt);
    cv::Mat::Mat(&resplt);
    cv::Mat::Mat(&resbg);
    uVar3 = std::random_device::_M_getval();
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&gen,(ulong)uVar3);
    rVar7 = std::uniform_real_distribution<double>::operator()(&local_2bb8,&gen);
    iVar1 = *(int *)((long)&local_2cb8[1]._M_prev + 4);
    rVar4 = std::uniform_int_distribution<int>::operator()(&intgen,&gen);
    rVar5 = std::uniform_int_distribution<int>::operator()(&intgen,&gen);
    iVar2 = *(int *)((long)&local_2cb8[1]._M_prev + 4);
    dVar8 = (rVar7 * local_2c90 * dVar10) / (double)iVar1;
    dVar11 = (double)*(int *)&local_2cb8[1]._M_prev * dVar8;
    std::operator<<((ostream *)&file,"1 ");
    dVar9 = (double)iVar2 * dVar8;
    poVar6 = std::ostream::_M_insert<double>((double)((int)dVar9 / 2 + rVar4) / dVar10);
    std::operator<<(poVar6," ");
    poVar6 = std::ostream::_M_insert<double>((double)((int)dVar11 / 2 + rVar5) / dVar10);
    std::operator<<(poVar6," ");
    poVar6 = std::ostream::_M_insert<double>((double)(int)dVar9 / dVar10);
    std::operator<<(poVar6," ");
    poVar6 = std::ostream::_M_insert<double>((double)(int)dVar11 / dVar10);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::ofstream::close();
    local_2c88.field_2._M_allocated_capacity = 0;
    local_2c88._M_dataplus._M_p._0_4_ = 0x1010000;
    local_2c88._M_string_length = (size_type)&back;
    local_2ca8.sz.width = 0;
    local_2ca8.sz.height = 0;
    local_2ca8.flags = 0x2010000;
    local_2ca8.obj = &resbg;
    local_2c68 = image_size;
    local_2c64 = image_size;
    cv::resize(0,0,&local_2c88,&local_2ca8,&local_2c68,1);
    poVar6 = std::operator<<((ostream *)&std::cout,"back");
    std::endl<char,std::char_traits<char>>(poVar6);
    local_2c88.field_2._M_allocated_capacity = 0;
    local_2c88._M_string_length = (size_type)(local_2cb8 + 1);
    local_2c88._M_dataplus._M_p._0_4_ = 0x1010000;
    local_2ca8.sz.width = 0;
    local_2ca8.sz.height = 0;
    local_2ca8.flags = 0x2010000;
    local_2ca8.obj = &resplt;
    local_2c10 = CONCAT44((int)(dVar8 * (double)(int)local_2cb8[1]._M_prev),
                          (int)(dVar8 * (double)(int)((ulong)local_2cb8[1]._M_prev >> 0x20)));
    cv::resize(0,0,&local_2c88,&local_2ca8,&local_2c10,1);
    poVar6 = std::operator<<((ostream *)&std::cout,"front");
    std::endl<char,std::char_traits<char>>(poVar6);
    local_2c88._M_dataplus._M_p._0_4_ = rVar4;
    local_2c88._M_dataplus._M_p._4_4_ = rVar5;
    overlayImage(&resbg,&resplt,(Point *)&local_2c88);
    std::operator+(&local_2c88,&name,".png");
    local_2ca8.sz.width = 0;
    local_2ca8.sz.height = 0;
    local_2ca8.flags = 0x1010000;
    local_2c08[0] = (vector)0x0;
    local_2c08[1] = (vector)0x0;
    local_2c08[2] = (vector)0x0;
    local_2c08[3] = (vector)0x0;
    local_2c08[4] = (vector)0x0;
    local_2c08[5] = (vector)0x0;
    local_2c08[6] = (vector)0x0;
    local_2c08[7] = (vector)0x0;
    local_2c08[8] = (vector)0x0;
    local_2c08[9] = (vector)0x0;
    local_2c08[10] = (vector)0x0;
    local_2c08[0xb] = (vector)0x0;
    local_2c08[0xc] = (vector)0x0;
    local_2c08[0xd] = (vector)0x0;
    local_2c08[0xe] = (vector)0x0;
    local_2c08[0xf] = (vector)0x0;
    local_2bf8 = 0;
    local_2ca8.obj = &resbg;
    cv::imwrite((string *)&local_2c88,&local_2ca8,local_2c08);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)local_2c08);
    std::__cxx11::string::~string((string *)&local_2c88);
    cv::Mat::~Mat(&resbg);
    cv::Mat::~Mat(&resplt);
    cv::Mat::~Mat(&back);
    std::ofstream::~ofstream(&file);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__cxx11::_List_base<cv::Mat,_std::allocator<cv::Mat>_>::_M_clear
            (&wrps.super__List_base<cv::Mat,_std::allocator<cv::Mat>_>);
  cv::Mat::~Mat(&blured);
  cv::Mat::~Mat(&plate);
  std::random_device::~random_device(&rd);
  return;
}

Assistant:

void generateDatasetImages(string plate_path, string backgr_path, string output_folder, int image_size, double plate_scale, int nwarps){
    static int imagenum;

    filesystem::create_directory(output_folder);
    
    random_device rd;  //Will be used to obtain a seed for the random number engine
    mt19937 gen(rd());
    uniform_int_distribution<> intgen(1, image_size-plate_scale*image_size);
    uniform_real_distribution<> realgen(0.8, 1);
    auto plate = cv::imread(plate_path, cv::IMREAD_UNCHANGED);
    cv::Mat blured;
    int ksize = (plate.rows/2)%2==0 ? plate.rows/2+1 : plate.rows/2;
    cv::GaussianBlur(plate, blured, cv::Size(ksize,ksize), cv::BORDER_DEFAULT);
    auto wrps = randomWarps(blured, nwarps);

    for (auto& plt: wrps) {
        imagenum++;
        string name = output_folder+"/" + to_string(imagenum);
        ofstream file;
        auto back = loadRandomImage(backgr_path);
        file.open(name + ".txt");
        cv::Mat resplt,resbg;
        gen.seed(rd());
        auto scale = realgen(gen)*plate_scale*image_size/plt.cols;
        int x = intgen(gen);
        int y =  intgen(gen);
        int width = scale*plt.cols;
        int hight = scale*plt.rows;
        double yolo_x = double(x+width/2)/image_size;
        double yolo_y = double(y+hight/2)/image_size;
        double yolo_w = double(width)/image_size;
        double yolo_h = double(hight)/image_size;
        file <<"1 "<<yolo_x<<" "<<yolo_y<<" "<<yolo_w<<" "<<yolo_h<<endl;
        file.close();
        cv::resize(back, resbg, cv::Size(image_size,image_size));
        cout<<"back"<<endl;
        cv::resize(plt, resplt, cv::Size(scale*plt.cols, scale*plt.rows));
        cout<<"front"<<endl;
        overlayImage(resbg, resplt, cv::Point(x,y));
        cv::imwrite(name + ".png", resbg);
    }
}